

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

int * __thiscall ImGuiStorage::GetIntRef(ImGuiStorage *this,ImGuiID key,int default_val)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  ImGuiStoragePair *__dest;
  int iVar4;
  ulong uVar5;
  ulong uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  ImGuiStoragePair *pIVar11;
  ulong uVar6;
  
  iVar2 = (this->Data).Size;
  uVar3 = (ulong)iVar2;
  __dest = (this->Data).Data;
  uVar6 = uVar3;
  pIVar11 = __dest;
  if (uVar3 == 0) {
    uVar3 = 0;
  }
  else {
    do {
      uVar5 = uVar6 >> 1;
      uVar7 = uVar5;
      if (pIVar11[uVar5].key < key) {
        uVar7 = ~uVar5 + uVar6;
        pIVar11 = pIVar11 + uVar5 + 1;
      }
      uVar6 = uVar7;
    } while (uVar7 != 0);
  }
  if ((pIVar11 == __dest + uVar3) || (pIVar11->key != key)) {
    lVar10 = (long)pIVar11 - (long)__dest;
    if (iVar2 == (this->Data).Capacity) {
      if (iVar2 == 0) {
        iVar4 = 8;
      }
      else {
        iVar4 = iVar2 / 2 + iVar2;
      }
      iVar9 = iVar2 + 1;
      if (iVar2 + 1 < iVar4) {
        iVar9 = iVar4;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiStoragePair *)(*GImAllocatorAllocFunc)((long)iVar9 << 4,GImAllocatorUserData);
      pIVar11 = (this->Data).Data;
      if (pIVar11 != (ImGuiStoragePair *)0x0) {
        memcpy(__dest,pIVar11,(long)(this->Data).Size << 4);
        pIVar11 = (this->Data).Data;
        if ((pIVar11 != (ImGuiStoragePair *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar11,GImAllocatorUserData);
      }
      (this->Data).Data = __dest;
      (this->Data).Capacity = iVar9;
      uVar3 = (ulong)(this->Data).Size;
    }
    lVar8 = uVar3 - (lVar10 >> 4);
    if (lVar8 != 0 && lVar10 >> 4 <= (long)uVar3) {
      memmove((void *)((long)__dest + lVar10 + 0x10),(void *)((long)__dest + lVar10),lVar8 * 0x10);
      __dest = (this->Data).Data;
    }
    *(ImGuiID *)((long)__dest + lVar10) = key;
    *(int *)((long)__dest + lVar10 + 8) = default_val;
    (this->Data).Size = (this->Data).Size + 1;
    pIVar11 = (ImGuiStoragePair *)(lVar10 + (long)(this->Data).Data);
  }
  return (int *)&pIVar11->field_1;
}

Assistant:

int* ImGuiStorage::GetIntRef(ImGuiID key, int default_val)
{
    ImGuiStoragePair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
        it = Data.insert(it, ImGuiStoragePair(key, default_val));
    return &it->val_i;
}